

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O1

int zt_unit_run_test(zt_unit *unit,zt_unit_suite *suite,zt_unit_test *test)

{
  int iVar1;
  char *pcVar2;
  
  test->success = 0;
  printf("%*s%s:\n",4,"",test->name);
  if (suite->setup_fn != (zt_unit_setup_fn)0x0) {
    (*suite->setup_fn)(suite->data);
  }
  iVar1 = (*suite->try_fn)(suite,test);
  if (iVar1 != 0) {
    test->success = 1;
  }
  if (suite->teardown_fn != (zt_unit_teardown_fn)0x0) {
    (*suite->teardown_fn)(suite->data);
  }
  iVar1 = printf("%*s%s",6,"","assertions");
  printf("%*s: %ld\n",(ulong)(0x1e - iVar1),"",test->assertions);
  if (test->exceptions != 0) {
    iVar1 = printf("%*s%s",6,"","unhandled_exceptions");
    printf("%*s: %ld\n",(ulong)(0x1e - iVar1),"",test->exceptions);
  }
  iVar1 = printf("%*s%s",6,"","result");
  pcVar2 = "failure";
  if (test->success == 1) {
    pcVar2 = "success";
  }
  printf("%*s: %s\n",(ulong)(0x1e - iVar1),"",pcVar2);
  return test->success;
}

Assistant:

int
zt_unit_run_test(struct zt_unit         * unit UNUSED,
                 struct zt_unit_suite   * suite,
                 struct zt_unit_test    * test)
{
    zt_assert(test);

    test->success = FALSE;

    yaml_dict(test->name, 4);

    if (suite->setup_fn) {
        suite->setup_fn(suite->data);
    }

    if(suite->try_fn(suite, test)) {
        test_passed(test);
    }

    if (suite->teardown_fn) {
        suite->teardown_fn(suite->data);
    }

    yaml_value("assertions", 6, "%ld", test->assertions);
    if (test->exceptions) {
        yaml_value("unhandled_exceptions", 6, "%ld", test->exceptions);
    }

    yaml_value("result", 6, "%s", test->success == TRUE ? "success" : "failure");

    return test->success;
}